

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyBinary
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uint segmentCount_00;
  size_t sVar4;
  uchar *puVar5;
  ulong start;
  ArrayPtr<const_unsigned_char> prefix_00;
  Fault local_40;
  Fault f;
  uint32_t segment0Offset;
  uint32_t segment0Size;
  uint32_t segmentCount;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  prefix_local.ptr = (uchar *)prefix.size_;
  this_local = (CompilerMain *)prefix.ptr;
  sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar4 < 8) {
    prefix_local.size_._4_4_ = PLAUSIBLE;
  }
  else {
    puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,0);
    uVar1 = *puVar5;
    puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,1);
    uVar2 = *puVar5;
    puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,2);
    uVar3 = *puVar5;
    puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,3);
    segmentCount_00 = CONCAT13(*puVar5,CONCAT12(uVar3,CONCAT11(uVar2,uVar1))) + 1;
    if (segmentCount_00 < 0x10001) {
      if (segmentCount_00 < 0x101) {
        puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,4);
        uVar1 = *puVar5;
        puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,5);
        uVar2 = *puVar5;
        puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,6);
        uVar3 = *puVar5;
        puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,7);
        if (CONCAT13(*puVar5,CONCAT12(uVar3,CONCAT11(uVar2,uVar1))) < 0x8000001) {
          f.exception._4_4_ = segmentCount_00 * 4 + 4;
          if ((f.exception._4_4_ & 7) != 0) {
            f.exception._4_4_ = segmentCount_00 * 4 + 8;
          }
          if ((f.exception._4_4_ & 7) != 0) {
            kj::_::Debug::Fault::Fault
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                       ,0x522,FAILED,"segment0Offset % 8 == 0","");
            kj::_::Debug::Fault::fatal(&local_40);
          }
          sVar4 = kj::ArrayPtr<const_unsigned_char>::size
                            ((ArrayPtr<const_unsigned_char> *)&this_local);
          if (sVar4 < f.exception._4_4_ + 8) {
            prefix_local.size_._4_4_ = PLAUSIBLE;
          }
          else {
            start = (ulong)f.exception._4_4_;
            sVar4 = kj::ArrayPtr<const_unsigned_char>::size
                              ((ArrayPtr<const_unsigned_char> *)&this_local);
            prefix_00 = kj::ArrayPtr<const_unsigned_char>::slice
                                  ((ArrayPtr<const_unsigned_char> *)&this_local,start,sVar4);
            prefix_local.size_._4_4_ = isPlausiblyFlat(this,prefix_00,segmentCount_00);
          }
        }
        else {
          prefix_local.size_._4_4_ = IMPLAUSIBLE;
        }
      }
      else {
        prefix_local.size_._4_4_ = IMPLAUSIBLE;
      }
    }
    else {
      prefix_local.size_._4_4_ = IMPOSSIBLE;
    }
  }
  return prefix_local.size_._4_4_;
}

Assistant:

Plausibility isPlausiblyBinary(kj::ArrayPtr<const byte> prefix) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    uint32_t segmentCount = prefix[0] | (prefix[1] << 8)
                          | (prefix[2] << 16) | (prefix[3] << 24);

    // Actually, the bytes store segmentCount - 1.
    ++segmentCount;

    if (segmentCount > 65536) {
      // While technically possible, this is so implausible that we should mark it impossible.
      // This helps to make sure we fail fast on packed input.
      return IMPOSSIBLE;
    } else if (segmentCount > 256) {
      // Implausible segment count.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Size = prefix[4] | (prefix[5] << 8)
                          | (prefix[6] << 16) | (prefix[7] << 24);

    if (segment0Size > (1 << 27)) {
      // Segment larger than 1G seems implausible.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Offset = 4 + segmentCount * 4;
    if (segment0Offset % 8 != 0) {
      segment0Offset += 4;
    }
    KJ_ASSERT(segment0Offset % 8 == 0);

    if (prefix.size() < segment0Offset + 8) {
      // Segment 0 is past our prefix, so we can't check it.
      return PLAUSIBLE;
    }

    return isPlausiblyFlat(prefix.slice(segment0Offset, prefix.size()), segmentCount);
  }